

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.cxx
# Opt level: O2

bool cmConfigureFileCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *in_path;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool escapeQuotes;
  bool atOnly;
  string *psVar6;
  iterator iVar7;
  ostream *poVar8;
  iterator __end2;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  bool copyonly;
  iterator __begin2;
  pointer arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  mode_t local_298;
  cmNewLineStyle newLineStyle;
  allocator<char> local_288 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  invalidOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filePermissionOptions;
  string unknown_args;
  string errorMessage;
  string outputFile;
  string inputFile;
  string e;
  
  in_path = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)in_path) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments, expected 2",
               (allocator<char> *)&inputFile);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&inputFile,in_path,psVar6);
  bVar4 = cmsys::SystemTools::FileIsDirectory(&inputFile);
  if (bVar4) {
    cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[41]>
              (&e,(char (*) [18])"input location\n  ",&inputFile,
               (char (*) [41])"\nis a directory but a file was expected.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&e);
    bVar4 = false;
    goto LAB_0025d948;
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&outputFile,pbVar1 + 1,psVar6);
  bVar4 = cmsys::SystemTools::FileIsDirectory(&outputFile);
  if (bVar4) {
    std::__cxx11::string::append((char *)&outputFile);
    cmsys::SystemTools::GetFilenameName(&e,in_path);
    std::__cxx11::string::append((string *)&outputFile);
    std::__cxx11::string::~string((string *)&e);
  }
  bVar4 = cmMakefile::CanIWriteThisFile(status->Makefile,&outputFile);
  if (bVar4) {
    errorMessage._M_dataplus._M_p = (pointer)&errorMessage.field_2;
    errorMessage._M_string_length = 0;
    errorMessage.field_2._M_local_buf[0] = '\0';
    cmNewLineStyle::cmNewLineStyle(&newLineStyle);
    bVar4 = cmNewLineStyle::ReadFromArguments(&newLineStyle,args,&errorMessage);
    if (bVar4) {
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filePermissionOptions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::noopOptions == '\0') &&
         (iVar10 = __cxa_guard_acquire(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                        ::noopOptions), iVar10 != 0)) {
        e._M_dataplus._M_p = (pointer)0x9;
        e._M_string_length = (size_type)anon_var_dwarf_68fa6f;
        e.field_2._M_allocated_capacity = 0xd;
        e.field_2._8_8_ =
             (long)"COPYONLY could not be used in combination with NEWLINE_STYLE" + 0x2f;
        __l._M_len = 7;
        __l._M_array = (iterator)&e;
        std::
        set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::set(&cmConfigureFileCommand::noopOptions,__l,
              (less<std::basic_string_view<char,_std::char_traits<char>_>_> *)&unknown_args,
              (allocator_type *)local_288);
        __cxa_atexit(std::
                     set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ::~set,&cmConfigureFileCommand::noopOptions,&__dso_handle);
        __cxa_guard_release(&cmConfigureFileCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::noopOptions);
      }
      unknown_args._M_dataplus._M_p = (pointer)&unknown_args.field_2;
      unknown_args._M_string_length = 0;
      unknown_args.field_2._M_local_buf[0] = '\0';
      iVar10 = 0;
      bVar4 = false;
      bVar3 = false;
      bVar2 = false;
      escapeQuotes = false;
      copyonly = false;
      atOnly = false;
      for (uVar12 = 2;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar12 = (ulong)((int)uVar12 + 1)) {
        bVar5 = std::operator==(pbVar1 + uVar12,"COPYONLY");
        if (bVar5) {
          bVar5 = cmNewLineStyle::IsValid(&newLineStyle);
          if (iVar10 == 1) {
            iVar10 = 2;
          }
          copyonly = true;
          if (bVar5) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"COPYONLY could not be used in combination with NEWLINE_STYLE",
                       local_288);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0025d908;
          }
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12,
                                  "ESCAPE_QUOTES");
          if (bVar5) {
            if (iVar10 == 1) {
              iVar10 = 2;
            }
            escapeQuotes = true;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12,"@ONLY");
            if (bVar5) {
              if (iVar10 == 1) {
                iVar10 = 2;
              }
              atOnly = true;
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar12,
                                      "NO_SOURCE_PERMISSIONS");
              if (bVar5) {
                bVar3 = true;
                if (iVar10 == 1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,
                             " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                             ,local_288);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_0025d908;
                }
              }
              else {
                bVar5 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar12,
                                        "USE_SOURCE_PERMISSIONS");
                if (bVar5) {
                  bVar2 = true;
                  if (iVar10 == 1) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&e,
                               " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                               ,local_288);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_0025d908;
                  }
                }
                else {
                  bVar5 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar12,
                                          "FILE_PERMISSIONS");
                  if (bVar5) {
                    if (bVar2) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&e,
                                 " given both FILE_PERMISSIONS and USE_SOURCE_PERMISSIONS. Only one option allowed."
                                 ,local_288);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_0025d908;
                    }
                    if (bVar3) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&e,
                                 " given both FILE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                                 ,local_288);
                      std::__cxx11::string::_M_assign((string *)&status->Error);
                      goto LAB_0025d908;
                    }
                    bVar5 = iVar10 == 0;
                    iVar10 = iVar10 + (uint)(iVar10 == 0);
                    bVar4 = (bool)(bVar4 | bVar5);
                  }
                  else {
                    pbVar1 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    e._M_string_length = (size_type)pbVar1[uVar12]._M_dataplus._M_p;
                    e._M_dataplus._M_p = (pointer)pbVar1[uVar12]._M_string_length;
                    iVar7 = std::
                            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ::find(&cmConfigureFileCommand::noopOptions._M_t,(key_type *)&e);
                    if ((_Rb_tree_header *)iVar7._M_node ==
                        &cmConfigureFileCommand::noopOptions._M_t._M_impl.super__Rb_tree_header) {
                      if (iVar10 == 1) {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::push_back(&filePermissionOptions,
                                    (args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar12);
                        iVar10 = 1;
                      }
                      else {
                        std::__cxx11::string::append((char *)&unknown_args);
                        std::__cxx11::string::append((string *)&unknown_args);
                        std::__cxx11::string::append((char *)&unknown_args);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (unknown_args._M_string_length != 0) {
        cmStrCat<char_const(&)[49],std::__cxx11::string&>
                  (&e,(char (*) [49])"configure_file called with unknown argument(s):\n",
                   &unknown_args);
        cmMakefile::IssueMessage(status->Makefile,AUTHOR_WARNING,&e);
        std::__cxx11::string::~string((string *)&e);
      }
      pbVar1 = filePermissionOptions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((bVar2) && (bVar3)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,
                   " given both USE_SOURCE_PERMISSIONS and NO_SOURCE_PERMISSIONS. Only one option allowed."
                   ,local_288);
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0025d908:
        std::__cxx11::string::~string((string *)&e);
LAB_0025d915:
        bVar4 = false;
      }
      else {
        local_298 = 0;
        if (bVar4) {
          if (filePermissionOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              filePermissionOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e," given FILE_PERMISSIONS without any options.",local_288);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_0025d908;
          }
          invalidOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          invalidOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          invalidOptions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (arg = filePermissionOptions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; arg != pbVar1; arg = arg + 1) {
            bVar4 = cmFSPermissions::stringToModeT(arg,&local_298);
            if (!bVar4) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&invalidOptions,arg);
            }
          }
          if (invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              invalidOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&invalidOptions);
            goto LAB_0025d7c1;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          std::operator<<((ostream *)&e," given invalid permission ");
          for (uVar11 = 0; uVar12 = (ulong)uVar11,
              uVar12 < (ulong)((long)invalidOptions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)invalidOptions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar11 = uVar11 + 1) {
            pcVar9 = "\"";
            if (uVar12 != 0) {
              pcVar9 = ",\"";
            }
            poVar8 = std::operator<<((ostream *)&e,pcVar9);
            poVar8 = std::operator<<(poVar8,(string *)
                                            (invalidOptions.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar12));
            std::operator<<(poVar8,"\"");
          }
          std::operator<<((ostream *)&e,".");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)local_288);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&invalidOptions);
          goto LAB_0025d915;
        }
LAB_0025d7c1:
        if (bVar3) {
          local_298 = local_298 | 0x1a4;
        }
        iVar10 = cmMakefile::ConfigureFile
                           (status->Makefile,&inputFile,&outputFile,copyonly,atOnly,escapeQuotes,
                            local_298,newLineStyle);
        bVar4 = true;
        if (iVar10 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"Problem configuring file",local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_0025d908;
        }
      }
      std::__cxx11::string::~string((string *)&unknown_args);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&filePermissionOptions);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&status->Error);
      bVar4 = false;
    }
    std::__cxx11::string::~string((string *)&errorMessage);
  }
  else {
    std::operator+(&errorMessage,"attempted to configure a file: ",&outputFile);
    std::operator+(&e,&errorMessage," into a source directory.");
    std::__cxx11::string::~string((string *)&errorMessage);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::string::~string((string *)&e);
    bVar4 = false;
  }
  std::__cxx11::string::~string((string *)&outputFile);
LAB_0025d948:
  std::__cxx11::string::~string((string *)&inputFile);
  return bVar4;
}

Assistant:

bool cmConfigureFileCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments, expected 2");
    return false;
  }

  std::string const& inFile = args[0];
  const std::string inputFile = cmSystemTools::CollapseFullPath(
    inFile, status.GetMakefile().GetCurrentSourceDirectory());

  // If the input location is a directory, error out.
  if (cmSystemTools::FileIsDirectory(inputFile)) {
    status.SetError(cmStrCat("input location\n  ", inputFile,
                             "\n"
                             "is a directory but a file was expected."));
    return false;
  }

  std::string const& outFile = args[1];
  std::string outputFile = cmSystemTools::CollapseFullPath(
    outFile, status.GetMakefile().GetCurrentBinaryDirectory());

  // If the output location is already a directory put the file in it.
  if (cmSystemTools::FileIsDirectory(outputFile)) {
    outputFile += "/";
    outputFile += cmSystemTools::GetFilenameName(inFile);
  }

  if (!status.GetMakefile().CanIWriteThisFile(outputFile)) {
    std::string e = "attempted to configure a file: " + outputFile +
      " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string errorMessage;
  cmNewLineStyle newLineStyle;
  if (!newLineStyle.ReadFromArguments(args, errorMessage)) {
    status.SetError(errorMessage);
    return false;
  }
  bool copyOnly = false;
  bool escapeQuotes = false;
  bool useSourcePermissions = false;
  bool noSourcePermissions = false;
  bool filePermissions = false;
  std::vector<std::string> filePermissionOptions;

  enum class Doing
  {
    DoingNone,
    DoingFilePermissions,
    DoneFilePermissions
  };

  Doing doing = Doing::DoingNone;

  static std::set<cm::string_view> noopOptions = {
    /* Legacy.  */
    "IMMEDIATE"_s,
    /* Handled by NewLineStyle member.  */
    "NEWLINE_STYLE"_s,
    "LF"_s,
    "UNIX"_s,
    "CRLF"_s,
    "WIN32"_s,
    "DOS"_s,
  };

  std::string unknown_args;
  bool atOnly = false;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "COPYONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      copyOnly = true;
      if (newLineStyle.IsValid()) {
        status.SetError("COPYONLY could not be used in combination "
                        "with NEWLINE_STYLE");
        return false;
      }
    } else if (args[i] == "ESCAPE_QUOTES") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      escapeQuotes = true;
    } else if (args[i] == "@ONLY") {
      if (doing == Doing::DoingFilePermissions) {
        doing = Doing::DoneFilePermissions;
      }
      atOnly = true;
    } else if (args[i] == "NO_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      noSourcePermissions = true;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (doing == Doing::DoingFilePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      useSourcePermissions = true;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (useSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "USE_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }
      if (noSourcePermissions) {
        status.SetError(" given both FILE_PERMISSIONS and "
                        "NO_SOURCE_PERMISSIONS. Only one option allowed.");
        return false;
      }

      if (doing == Doing::DoingNone) {
        doing = Doing::DoingFilePermissions;
        filePermissions = true;
      }
    } else if (noopOptions.find(args[i]) != noopOptions.end()) {
      /* Ignore no-op options.  */
    } else if (doing == Doing::DoingFilePermissions) {
      filePermissionOptions.push_back(args[i]);
    } else {
      unknown_args += " ";
      unknown_args += args[i];
      unknown_args += "\n";
    }
  }
  if (!unknown_args.empty()) {
    std::string msg = cmStrCat(
      "configure_file called with unknown argument(s):\n", unknown_args);
    status.GetMakefile().IssueMessage(MessageType::AUTHOR_WARNING, msg);
  }

  if (useSourcePermissions && noSourcePermissions) {
    status.SetError(" given both USE_SOURCE_PERMISSIONS and "
                    "NO_SOURCE_PERMISSIONS. Only one option allowed.");
    return false;
  }

  mode_t permissions = 0;

  if (filePermissions) {
    if (filePermissionOptions.empty()) {
      status.SetError(" given FILE_PERMISSIONS without any options.");
      return false;
    }

    std::vector<std::string> invalidOptions;
    for (auto const& e : filePermissionOptions) {
      if (!cmFSPermissions::stringToModeT(e, permissions)) {
        invalidOptions.push_back(e);
      }
    }

    if (!invalidOptions.empty()) {
      std::ostringstream oss;
      oss << " given invalid permission ";
      for (auto i = 0u; i < invalidOptions.size(); i++) {
        if (i == 0u) {
          oss << "\"" << invalidOptions[i] << "\"";
        } else {
          oss << ",\"" << invalidOptions[i] << "\"";
        }
      }
      oss << ".";
      status.SetError(oss.str());
      return false;
    }
  }

  if (noSourcePermissions) {
    permissions |= cmFSPermissions::mode_owner_read;
    permissions |= cmFSPermissions::mode_owner_write;
    permissions |= cmFSPermissions::mode_group_read;
    permissions |= cmFSPermissions::mode_world_read;
  }

  if (!status.GetMakefile().ConfigureFile(inputFile, outputFile, copyOnly,
                                          atOnly, escapeQuotes, permissions,
                                          newLineStyle)) {
    status.SetError("Problem configuring file");
    return false;
  }

  return true;
}